

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessXFBTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::DirectStateAccess::TransformFeedback::ErrorsTest::testQueriesForInvalidNameOfObject
          (ErrorsTest *this)

{
  ostringstream *poVar1;
  char cVar2;
  int iVar3;
  undefined4 extraout_var;
  GLuint GVar5;
  GLint buffer;
  GLint64 buffer64;
  GLint local_1cc;
  Enum<int,_2UL> local_1c8;
  GLint64 local_1b8;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  long lVar4;
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar3);
  GVar5 = 0;
  do {
    GVar5 = GVar5 + 1;
    cVar2 = (**(code **)(lVar4 + 0xcd0))(GVar5);
  } while (cVar2 == '\x01');
  local_1cc = 0x4cb2f;
  local_1b8 = 0x4cb2f;
  (*this->m_gl_getTransformFeedbackiv)(GVar5,0x8e23,&local_1cc);
  iVar3 = (**(code **)(lVar4 + 0x800))();
  if (iVar3 == 0x502) {
    if (local_1cc == 0x4cb2f) {
      iVar3 = (**(code **)(lVar4 + 0x800))();
      if (iVar3 != 0) {
        poVar1 = (ostringstream *)(local_1b0 + 8);
        do {
          local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,
                     "Warning! glGetTransformFeedbackiv called with invalid object name has generated more than one error, The next error was  "
                     ,0x79);
          local_1c8.m_getName = glu::getErrorName;
          local_1c8.m_value = iVar3;
          tcu::Format::Enum<int,_2UL>::toStream(&local_1c8,(ostream *)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,".",1);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar1);
          std::ios_base::~ios_base(local_138);
          iVar3 = (**(code **)(lVar4 + 0x800))();
        } while (iVar3 != 0);
      }
      (*this->m_gl_getTransformFeedbacki_v)(GVar5,0x8c8f,0,&local_1cc);
      iVar3 = (**(code **)(lVar4 + 0x800))();
      if (iVar3 == 0x502) {
        if (local_1cc == 0x4cb2f) {
          iVar3 = (**(code **)(lVar4 + 0x800))();
          if (iVar3 != 0) {
            poVar1 = (ostringstream *)(local_1b0 + 8);
            do {
              local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
              std::__cxx11::ostringstream::ostringstream(poVar1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar1,
                         "Warning! glGetTransformFeedbacki_v called with invalid object name has unexpectedly generated more than one error, The next error was  "
                         ,0x87);
              local_1c8.m_getName = glu::getErrorName;
              local_1c8.m_value = iVar3;
              tcu::Format::Enum<int,_2UL>::toStream(&local_1c8,(ostream *)poVar1);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,".",1);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream(poVar1);
              std::ios_base::~ios_base(local_138);
              iVar3 = (**(code **)(lVar4 + 0x800))();
            } while (iVar3 != 0);
          }
          (*this->m_gl_getTransformFeedbacki64_v)(GVar5,0x8c84,0,&local_1b8);
          iVar3 = (**(code **)(lVar4 + 0x800))();
          if (iVar3 == 0x502) {
            if (local_1b8 == 0x4cb2f) {
              iVar3 = (**(code **)(lVar4 + 0x800))();
              if (iVar3 == 0) {
                return true;
              }
              poVar1 = (ostringstream *)(local_1b0 + 8);
              do {
                local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
                std::__cxx11::ostringstream::ostringstream(poVar1);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar1,
                           "Warning! glGetTransformFeedbacki64_v called with invalid object name has unexpectedly generated more than one error, The next error was  "
                           ,0x89);
                local_1c8.m_getName = glu::getErrorName;
                local_1c8.m_value = iVar3;
                tcu::Format::Enum<int,_2UL>::toStream(&local_1c8,(ostream *)poVar1);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,".",1);
                tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
                std::__cxx11::ostringstream::~ostringstream(poVar1);
                std::ios_base::~ios_base(local_138);
                iVar3 = (**(code **)(lVar4 + 0x800))();
              } while (iVar3 != 0);
              return true;
            }
            local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_1b0 + 8),
                       "glGetTransformFeedbacki64_v called with invalid object name had been expected not to change the given buffer."
                       ,0x6d);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          }
          else {
            local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
            poVar1 = (ostringstream *)(local_1b0 + 8);
            std::__cxx11::ostringstream::ostringstream(poVar1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,
                       "glGetTransformFeedbacki64_v called with invalid object name had been expected to generate GL_INVALID_OPERATION. However, "
                       ,0x79);
            local_1c8.m_getName = glu::getErrorName;
            local_1c8.m_value = iVar3;
            tcu::Format::Enum<int,_2UL>::toStream(&local_1c8,(ostream *)poVar1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1," was captured.",0xe);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          }
        }
        else {
          local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_1b0 + 8),
                     "glGetTransformFeedbacki_v called with invalid object name had been expected not to change the given buffer."
                     ,0x6b);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        }
      }
      else {
        local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,
                   "glGetTransformFeedbacki_v called with invalid object name had been expected to generate GL_INVALID_OPERATION. However, "
                   ,0x77);
        local_1c8.m_getName = glu::getErrorName;
        local_1c8.m_value = iVar3;
        tcu::Format::Enum<int,_2UL>::toStream(&local_1c8,(ostream *)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," was captured.",0xe);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      }
    }
    else {
      local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b0 + 8),
                 "glGetTransformFeedbackiv called with invalid object name had been expected not to change the given buffer."
                 ,0x6a);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
  }
  else {
    local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "glGetTransformFeedbackiv called with invalid object name had been expected to generate GL_INVALID_OPERATION. However, "
               ,0x76);
    local_1c8.m_getName = glu::getErrorName;
    local_1c8.m_value = iVar3;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1c8,(ostream *)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," was captured.",0xe);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
  std::ios_base::~ios_base(local_138);
  return false;
}

Assistant:

bool ErrorsTest::testQueriesForInvalidNameOfObject()
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Generating not a-TransformFeedback name. */
	glw::GLuint invalid_name = 0;

	while (GL_TRUE == gl.isTransformFeedback(++invalid_name))
		;

	/* Dummy storage. */
	glw::GLint   buffer   = 314159;
	glw::GLint64 buffer64 = 314159;

	/* Error variable. */
	glw::GLenum error = 0;

	/* Test of GetTransformFeedbackiv. */
	m_gl_getTransformFeedbackiv(invalid_name, GL_TRANSFORM_FEEDBACK_PAUSED, &buffer);

	if (GL_INVALID_OPERATION != (error = gl.getError()))
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "glGetTransformFeedbackiv called with invalid object name had been "
											   "expected to generate GL_INVALID_OPERATION. However, "
											<< glu::getErrorStr(error) << " was captured." << tcu::TestLog::EndMessage;

		return false;
	}

	if (314159 != buffer)
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "glGetTransformFeedbackiv called with invalid object name had been "
											   "expected not to change the given buffer."
											<< tcu::TestLog::EndMessage;

		return false;
	}

	while (GL_NO_ERROR != (error = gl.getError()))
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "Warning! glGetTransformFeedbackiv called with invalid object name has "
											   "generated more than one error, The next error was  "
											<< glu::getErrorStr(error) << "." << tcu::TestLog::EndMessage;
	}

	/* Test of GetTransformFeedbacki_v. */
	m_gl_getTransformFeedbacki_v(invalid_name, GL_TRANSFORM_FEEDBACK_BUFFER_BINDING, 0, &buffer);

	if (GL_INVALID_OPERATION != (error = gl.getError()))
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "glGetTransformFeedbacki_v called with invalid object name had been "
											   "expected to generate GL_INVALID_OPERATION. However, "
											<< glu::getErrorStr(error) << " was captured." << tcu::TestLog::EndMessage;

		return false;
	}

	if (314159 != buffer)
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "glGetTransformFeedbacki_v called with invalid object name had been "
											   "expected not to change the given buffer."
											<< tcu::TestLog::EndMessage;

		return false;
	}

	while (GL_NO_ERROR != (error = gl.getError()))
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "Warning! glGetTransformFeedbacki_v called with invalid object name has "
											   "unexpectedly generated more than one error, The next error was  "
											<< glu::getErrorStr(error) << "." << tcu::TestLog::EndMessage;
	}

	/* Test of GetTransformFeedbacki64_v. */
	m_gl_getTransformFeedbacki64_v(invalid_name, GL_TRANSFORM_FEEDBACK_BUFFER_START, 0, &buffer64);

	if (GL_INVALID_OPERATION != (error = gl.getError()))
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "glGetTransformFeedbacki64_v called with invalid object name had been "
											   "expected to generate GL_INVALID_OPERATION. However, "
											<< glu::getErrorStr(error) << " was captured." << tcu::TestLog::EndMessage;

		return false;
	}

	if (314159 != buffer64)
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "glGetTransformFeedbacki64_v called with invalid object name had been "
											   "expected not to change the given buffer."
											<< tcu::TestLog::EndMessage;

		return false;
	}

	while (GL_NO_ERROR != (error = gl.getError()))
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "Warning! glGetTransformFeedbacki64_v called with invalid object name "
											   "has unexpectedly generated more than one error, The next error was  "
											<< glu::getErrorStr(error) << "." << tcu::TestLog::EndMessage;
	}

	return true;
}